

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O1

target_ulong helper_fclass_d_riscv64(uint64_t frs1)

{
  int iVar1;
  ulong uVar2;
  target_ulong tVar3;
  target_ulong tVar4;
  float64 f;
  float_status s;
  float_status local_8;
  
  uVar2 = frs1 & 0x7fffffffffffffff;
  if (uVar2 == 0) {
    return (ulong)(-1 < (long)frs1) * 8 + 8;
  }
  if (uVar2 == 0x7ff0000000000000) {
    tVar4 = 0x80;
    tVar3 = 1;
  }
  else if ((frs1 & 0x7ff0000000000000) == 0) {
    tVar4 = 0x20;
    tVar3 = 4;
  }
  else {
    if (0x7ff0000000000000 < uVar2) {
      local_8.float_detect_tininess = '\0';
      local_8.float_rounding_mode = '\0';
      local_8.float_exception_flags = '\0';
      local_8.floatx80_rounding_precision = '\0';
      local_8.flush_to_zero = '\0';
      local_8.flush_inputs_to_zero = '\0';
      local_8.default_nan_mode = '\0';
      local_8.snan_bit_is_one = '\0';
      iVar1 = float64_is_quiet_nan_riscv64(frs1,&local_8);
      return (ulong)(iVar1 != 0) * 0x100 + 0x100;
    }
    tVar4 = 0x40;
    tVar3 = 2;
  }
  if (-1 < (long)frs1) {
    tVar3 = tVar4;
  }
  return tVar3;
}

Assistant:

target_ulong helper_fclass_d(uint64_t frs1)
{
    float64 f = frs1;
    bool sign = float64_is_neg(f);

    if (float64_is_infinity(f)) {
        return sign ? 1 << 0 : 1 << 7;
    } else if (float64_is_zero(f)) {
        return sign ? 1 << 3 : 1 << 4;
    } else if (float64_is_zero_or_denormal(f)) {
        return sign ? 1 << 2 : 1 << 5;
    } else if (float64_is_any_nan(f)) {
        float_status s = { 0 }; /* for snan_bit_is_one */
        return float64_is_quiet_nan(f, &s) ? 1 << 9 : 1 << 8;
    } else {
        return sign ? 1 << 1 : 1 << 6;
    }
}